

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  TestPartResultArray *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  HasOneFailure(&gtest_ar.success_,in_RSI,in_RDX,in_RCX,(Type)this->results_,
                (string *)(ulong)this->type_);
  if (gtest_ar.success_ == false) {
    Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/googletest/googletest/src/gtest.cc"
               ,0x2ab,message);
    AssertHelper::operator=(&local_28,(Message *)&local_20);
    AssertHelper::~AssertHelper(&local_28);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&this->substr_);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}